

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_filling_magic_number.cc
# Opt level: O3

int __thiscall sptk::InputSourceFillingMagicNumber::Proceed(InputSourceFillingMagicNumber *this)

{
  double dVar1;
  double dVar2;
  _Elt_pointer pvVar3;
  double *pdVar4;
  _Map_pointer ppvVar5;
  pointer piVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  _Elt_pointer pvVar9;
  pointer pdVar10;
  pointer pdVar11;
  _Elt_pointer pvVar12;
  uint uVar13;
  int iVar14;
  _Map_pointer ppvVar15;
  ulong uVar16;
  vector<double,_std::allocator<double>_> *pvVar17;
  double *pdVar18;
  double *pdVar19;
  vector<double,_std::allocator<double>_> *pvVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  _Map_pointer ppvVar27;
  long lVar28;
  _Elt_pointer pvVar29;
  vector<double,_std::allocator<double>_> *pvVar30;
  _Elt_pointer pvVar31;
  double dVar32;
  double dVar33;
  vector<double,_std::allocator<double>_> curr_data;
  value_type local_48;
  
  pvVar3 = (this->queue_).
           super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->queue_).
      super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pvVar3) goto LAB_001052c7;
  pdVar19 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar4 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar32 = this->magic_number_;
  uVar25 = (long)pdVar4 - (long)pdVar19;
  if (0 < (long)uVar25 >> 5) {
    pdVar18 = (double *)((uVar25 & 0xffffffffffffffe0) + (long)pdVar19);
    lVar23 = ((long)uVar25 >> 5) + 1;
    pdVar19 = pdVar19 + 2;
    do {
      if ((pdVar19[-2] == dVar32) && (!NAN(pdVar19[-2]) && !NAN(dVar32))) {
        pdVar19 = pdVar19 + -2;
        goto LAB_001052be;
      }
      if ((pdVar19[-1] == dVar32) && (!NAN(pdVar19[-1]) && !NAN(dVar32))) {
        pdVar19 = pdVar19 + -1;
        goto LAB_001052be;
      }
      if ((*pdVar19 == dVar32) && (!NAN(*pdVar19) && !NAN(dVar32))) goto LAB_001052be;
      if ((pdVar19[1] == dVar32) && (!NAN(pdVar19[1]) && !NAN(dVar32))) {
        pdVar19 = pdVar19 + 1;
        goto LAB_001052be;
      }
      lVar23 = lVar23 + -1;
      pdVar19 = pdVar19 + 4;
    } while (1 < lVar23);
    uVar25 = (long)pdVar4 - (long)pdVar18;
    pdVar19 = pdVar18;
  }
  lVar23 = (long)uVar25 >> 3;
  if (lVar23 == 1) {
LAB_001052a7:
    if (*pdVar19 != dVar32) {
      return 2;
    }
    if (NAN(*pdVar19) || NAN(dVar32)) {
      return 2;
    }
  }
  else if (lVar23 == 2) {
LAB_00105280:
    if ((*pdVar19 != dVar32) || (NAN(*pdVar19) || NAN(dVar32))) {
      pdVar19 = pdVar19 + 1;
      goto LAB_001052a7;
    }
  }
  else {
    if (lVar23 != 3) {
      return 2;
    }
    if ((*pdVar19 != dVar32) || (NAN(*pdVar19) || NAN(dVar32))) {
      pdVar19 = pdVar19 + 1;
      goto LAB_00105280;
    }
  }
LAB_001052be:
  if (pdVar19 == pdVar4) {
    return 2;
  }
LAB_001052c7:
  uVar13 = (*(this->super_InputSourceInterface)._vptr_InputSourceInterface[2])(this);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar14 = (*this->source_->_vptr_InputSourceInterface[4])();
  if ((char)iVar14 == '\0') {
    pvVar3 = (this->queue_).
             super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pvVar9 = (this->queue_).
             super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == pvVar3) {
      iVar14 = 0;
    }
    else {
      iVar14 = 2;
      if (0 < (int)uVar13) {
        pdVar10 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = (this->final_output_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar12 = (this->queue_).
                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppvVar5 = (this->queue_).
                  super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        uVar25 = 0;
        do {
          dVar32 = this->magic_number_;
          pdVar19 = pdVar10 + uVar25;
          if ((dVar32 == *pdVar19) && (!NAN(dVar32) && !NAN(*pdVar19))) {
            dVar1 = pdVar11[uVar25];
            ppvVar27 = ppvVar5;
            pvVar29 = pvVar3;
            pvVar31 = pvVar12;
            if ((dVar32 == dVar1) && (!NAN(dVar32) && !NAN(dVar1))) {
              iVar14 = 1;
              break;
            }
            do {
              (pvVar29->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar25] = dVar1;
              pvVar29 = pvVar29 + 1;
              if (pvVar29 == pvVar31) {
                pvVar29 = ppvVar27[1];
                ppvVar27 = ppvVar27 + 1;
                pvVar31 = pvVar29 + 0x15;
              }
            } while (pvVar29 != pvVar9);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar13);
      }
    }
  }
  else {
    if (0 < (int)uVar13) {
      ppvVar5 = (this->queue_).
                super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppvVar27 = (this->queue_).
                 super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      piVar6 = (this->magic_number_region_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar3 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      pvVar7 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pvVar8 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      pvVar9 = (this->queue_).
               super__Deque_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar26 = ((long)pvVar7 - (long)pvVar8 >> 3) * -0x5555555555555555;
      pdVar10 = (this->final_output_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar25 = 0;
      do {
        dVar32 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar25];
        dVar1 = this->magic_number_;
        iVar14 = piVar6[uVar25];
        lVar23 = (long)iVar14;
        if ((dVar1 != dVar32) || (NAN(dVar1) || NAN(dVar32))) {
          if (iVar14 != 0) {
            if (iVar14 == (int)((ulong)((long)pvVar3 - (long)pvVar9) >> 3) * -0x55555555 +
                          (int)uVar26 +
                          ((int)((ulong)((long)ppvVar5 - (long)ppvVar27) >> 3) + -1 +
                          (uint)(ppvVar5 == (_Map_pointer)0x0)) * 0x15) {
              dVar2 = pdVar10[uVar25];
              if ((dVar1 != dVar2) || (dVar33 = dVar32, NAN(dVar1) || NAN(dVar2))) {
                dVar33 = dVar2;
              }
            }
            else {
              uVar21 = uVar26 - lVar23;
              if ((long)uVar21 < 0) {
                uVar24 = ~(~uVar21 / 0x15);
LAB_00105471:
                ppvVar15 = ppvVar5 + uVar24;
                pvVar17 = *ppvVar15;
                pvVar20 = pvVar17 + uVar24 * -0x15 + uVar21;
              }
              else {
                if (0x14 < uVar21) {
                  uVar24 = uVar21 / 0x15;
                  goto LAB_00105471;
                }
                pvVar20 = pvVar7 + -lVar23;
                ppvVar15 = ppvVar5;
                pvVar17 = pvVar8;
              }
              if (pvVar20 == pvVar17) {
                pvVar20 = ppvVar15[-1] + 0x15;
              }
              dVar33 = pvVar20[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar25];
            }
            iVar22 = 0;
            if (0 < iVar14) {
              dVar33 = dVar33 - dVar32;
              lVar28 = 0;
              uVar21 = ~uVar26;
              uVar24 = uVar26;
              pvVar20 = pvVar7;
              do {
                if ((long)uVar24 < 0) {
                  uVar16 = ~(uVar21 / 0x15);
LAB_0010552a:
                  ppvVar15 = ppvVar5 + uVar16;
                  pvVar30 = *ppvVar15;
                  pvVar17 = pvVar30 + uVar16 * -0x15 + (uVar26 - lVar28);
                }
                else {
                  pvVar17 = pvVar20;
                  ppvVar15 = ppvVar5;
                  pvVar30 = pvVar8;
                  if (0x14 < uVar24) {
                    uVar16 = uVar24 / 0x15;
                    goto LAB_0010552a;
                  }
                }
                if (pvVar17 == pvVar30) {
                  pvVar17 = ppvVar15[-1] + 0x15;
                }
                dVar32 = dVar32 + dVar33 / (double)(iVar14 + 1);
                pvVar17[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar25] = dVar32;
                lVar28 = lVar28 + 1;
                pvVar20 = pvVar20 + -1;
                uVar24 = uVar24 - 1;
                uVar21 = uVar21 + 1;
                lVar23 = lVar23 + -1;
              } while (lVar23 != 0);
            }
            goto LAB_001053c2;
          }
        }
        else {
          iVar22 = iVar14 + 1;
LAB_001053c2:
          piVar6[uVar25] = iVar22;
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar13);
    }
    iVar14 = 3;
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->queue_,&local_48);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar14;
}

Assistant:

int InputSourceFillingMagicNumber::Proceed() {
  // If magic number is not in the front of queue, you can output the data.
  if (!queue_.empty()) {
    if (std::find_if(queue_.front().begin(), queue_.front().end(),
                     [this](double x) { return magic_number_ == x; }) ==
        queue_.front().end()) {
      return kGood;
    }
  }

  const int data_size(GetSize());

  // Load new data.
  std::vector<double> curr_data;
  if (!source_->Get(&curr_data)) {
    if (queue_.empty()) {
      return kExit;
    }
    for (int i(0); i < data_size; ++i) {
      if (magic_number_ == queue_.front()[i]) {
        if (magic_number_ == final_output_[i]) {
          // This means all the data is magic number.
          return kFail;
        }
        // Replace magic number with final output value.
        for (std::deque<std::vector<double> >::iterator itr(queue_.begin());
             itr != queue_.end(); ++itr) {
          (*itr)[i] = final_output_[i];
        }
      }
    }
    return kGood;
  }

  for (int i(0); i < data_size; ++i) {
    const double right(curr_data[i]);

    if (magic_number_ == right) {
      ++magic_number_region_[i];
    } else if (magic_number_region_[i]) {
      // Interpolate magic numbers.
      double left;
      if (static_cast<int>(queue_.size()) != magic_number_region_[i]) {
        left = (*(queue_.rbegin() + magic_number_region_[i]))[i];
      } else if (magic_number_ != final_output_[i]) {
        left = final_output_[i];
      } else {
        left = right;
      }
      const double slope((left - right) / (magic_number_region_[i] + 1));
      double value(right);
      for (int j(0); j < magic_number_region_[i]; ++j) {
        value += slope;
        (*(queue_.rbegin() + j))[i] = value;
      }
      magic_number_region_[i] = 0;
    }
  }
  queue_.push_back(curr_data);

  return kWait;
}